

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

void __thiscall
GdlRenderer::DebugClasses
          (GdlRenderer *this,ostream *strmOut,
          vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_> *vpglfcReplcmt,
          int cpglfcLinear)

{
  pointer *ppuVar1;
  GdlGlyphClassDefn *pGVar2;
  pointer pcVar3;
  ostream *poVar4;
  pointer ppGVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  vector<unsigned_short,_std::allocator<unsigned_short>_> vwGlyphs;
  vector<int,_std::allocator<int>_> vnIndices;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_88;
  int local_64;
  vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_> *local_60;
  vector<int,_std::allocator<int>_> local_58;
  ulong local_38;
  
  local_60 = vpglfcReplcmt;
  std::__ostream_insert<char,std::char_traits<char>>(strmOut,"LINEAR (OUTPUT) CLASSES",0x17);
  local_64 = cpglfcLinear;
  if (0 < cpglfcLinear) {
    local_38 = (ulong)(uint)cpglfcLinear;
    uVar7 = 0;
    do {
      pGVar2 = (local_60->
               super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>).
               _M_impl.super__Vector_impl_data._M_start[uVar7];
      std::__ostream_insert<char,std::char_traits<char>>(strmOut,"\n\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(strmOut,"Class #",7);
      poVar4 = (ostream *)std::ostream::operator<<(strmOut,(int)uVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
      ppuVar1 = &local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      pcVar3 = (pGVar2->m_staName)._M_dataplus._M_p;
      local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)ppuVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,pcVar3,pcVar3 + (pGVar2->m_staName)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (strmOut,(char *)local_88.
                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                 ._M_impl.super__Vector_impl_data._M_start,
                 (long)local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
      if ((pointer *)
          local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != ppuVar1) {
        operator_delete(local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_88.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
      }
      local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      GdlGlyphClassDefn::GenerateOutputGlyphList(pGVar2,&local_88);
      if (local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar6 = 0;
        do {
          if ((uVar6 / 5 & 0xfffffffffffffffe) * 5 == uVar6) {
            std::__ostream_insert<char,std::char_traits<char>>(strmOut,"\n",1);
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)strmOut);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
          }
          std::__ostream_insert<char,std::char_traits<char>>(strmOut,"   ",3);
          GrcManager::DebugHex
                    (strmOut,local_88.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar6]);
          uVar6 = uVar6 + 1;
        } while (uVar6 < (ulong)((long)local_88.
                                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_88.
                                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 1));
      }
      if (local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_88.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != local_38);
  }
  std::__ostream_insert<char,std::char_traits<char>>(strmOut,"\n\n\nINDEXED (INPUT) CLASSES",0x1a);
  ppGVar5 = (local_60->super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (local_64 <
      (int)((ulong)((long)(local_60->
                          super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)ppGVar5) >> 3)) {
    lVar8 = (long)local_64;
    do {
      pGVar2 = ppGVar5[lVar8];
      std::__ostream_insert<char,std::char_traits<char>>(strmOut,"\n\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(strmOut,"Class #",7);
      poVar4 = (ostream *)std::ostream::operator<<(strmOut,(int)lVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
      ppuVar1 = &local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      pcVar3 = (pGVar2->m_staName)._M_dataplus._M_p;
      local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)ppuVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,pcVar3,pcVar3 + (pGVar2->m_staName)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (strmOut,(char *)local_88.
                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                 ._M_impl.super__Vector_impl_data._M_start,
                 (long)local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
      if ((pointer *)
          local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != ppuVar1) {
        operator_delete(local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_88.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
      }
      local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      GdlGlyphClassDefn::GenerateInputGlyphList(pGVar2,&local_88,&local_58);
      if (local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar7 = 0;
        do {
          if ((uVar7 / 5) * 5 == uVar7) {
            std::__ostream_insert<char,std::char_traits<char>>(strmOut,"\n",1);
          }
          GrcManager::DebugHex
                    (strmOut,local_88.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar7]);
          std::__ostream_insert<char,std::char_traits<char>>(strmOut," :",2);
          if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar7] < 1000) {
            std::__ostream_insert<char,std::char_traits<char>>(strmOut," ",1);
          }
          if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar7] < 100) {
            std::__ostream_insert<char,std::char_traits<char>>(strmOut," ",1);
          }
          if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar7] < 10) {
            std::__ostream_insert<char,std::char_traits<char>>(strmOut," ",1);
          }
          std::ostream::operator<<
                    (strmOut,local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar7]);
          std::__ostream_insert<char,std::char_traits<char>>(strmOut,"    ",4);
          uVar7 = uVar7 + 1;
        } while (uVar7 < (ulong)((long)local_88.
                                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_88.
                                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 1));
      }
      if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_88.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      lVar8 = lVar8 + 1;
      ppGVar5 = (local_60->
                super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
    } while (lVar8 < (int)((ulong)((long)(local_60->
                                         super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)ppGVar5
                                  ) >> 3));
  }
  return;
}

Assistant:

void GdlRenderer::DebugClasses(std::ostream & strmOut,
	std::vector<GdlGlyphClassDefn *> & vpglfcReplcmt, int cpglfcLinear)
{
	strmOut << "LINEAR (OUTPUT) CLASSES";

	//	linear classes (output)
	int cTmp = 0;
	int ipglfc;
	for (ipglfc = 0; ipglfc < cpglfcLinear; ipglfc++)
	{
		GdlGlyphClassDefn * pglfc = vpglfcReplcmt[ipglfc];

		Assert(pglfc->ReplcmtOutputClass() || pglfc->GlyphIDCount() <= 1);
		//Assert(pglfc->ReplcmtOutputID() == cTmp);

		strmOut << "\n\n";
		strmOut << "Class #" << ipglfc << ": ";
		strmOut << pglfc->Name();

		std::vector<utf16> vwGlyphs;
		pglfc->GenerateOutputGlyphList(vwGlyphs);

		//	glyph list
		for (size_t iw = 0; iw < vwGlyphs.size(); iw++)
		{
			if (iw % 10 == 0)
			{
				strmOut << "\n" << iw << ":";
			}
			strmOut << "   ";
			GrcManager::DebugHex(strmOut, vwGlyphs[iw]);
		}

		cTmp++;
	}

	strmOut << "\n\n\nINDEXED (INPUT) CLASSES";

	//	indexed classes (input)
	for (ipglfc = cpglfcLinear; ipglfc < signed(vpglfcReplcmt.size()); ipglfc++)
	{
		GdlGlyphClassDefn * pglfc = vpglfcReplcmt[ipglfc];

		Assert(pglfc->ReplcmtInputClass());
		Assert(pglfc->ReplcmtInputID() == cTmp);

		strmOut << "\n\n";
		strmOut << "Class #" << ipglfc << ": ";
		strmOut << pglfc->Name();

		std::vector<utf16> vwGlyphs;
		std::vector<int> vnIndices;
		pglfc->GenerateInputGlyphList(vwGlyphs, vnIndices);
		//	glyph list
		for (size_t iw = 0; iw < vwGlyphs.size(); iw++)
		{
			if (iw % 5 == 0)
			{
				strmOut << "\n";
			}
			GrcManager::DebugHex(strmOut, vwGlyphs[iw]);
			strmOut << " :";
			if (vnIndices[iw] < 1000) strmOut << " ";
			if (vnIndices[iw] < 100)  strmOut << " ";
			if (vnIndices[iw] < 10)   strmOut << " ";
			strmOut << vnIndices[iw];
			strmOut << "    ";
		}

		cTmp++;
	}
}